

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

vector<Token,_std::allocator<Token>_> * __thiscall
Tokenizer::Tokenize(vector<Token,_std::allocator<Token>_> *__return_storage_ptr__,Tokenizer *this)

{
  bool bVar1;
  Token *__args;
  ostream *this_00;
  undefined1 local_48 [8];
  optional<Token> p;
  Tokenizer *this_local;
  vector<Token,_std::allocator<Token>_> *result;
  
  p.super__Optional_base<Token,_false,_false>._M_payload.
  super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>._39_1_ = 0;
  std::vector<Token,_std::allocator<Token>_>::vector(__return_storage_ptr__);
  do {
    NextToken((optional<Token> *)local_48,this);
    bVar1 = std::optional<Token>::has_value((optional<Token> *)local_48);
    if (bVar1) {
      __args = std::optional<Token>::value((optional<Token> *)local_48);
      std::vector<Token,std::allocator<Token>>::emplace_back<Token&>
                ((vector<Token,std::allocator<Token>> *)__return_storage_ptr__,__args);
    }
    else {
      this_00 = std::operator<<((ostream *)&std::cout,"Tokenizer successful return.");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      p.super__Optional_base<Token,_false,_false>._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>._39_1_
           = 1;
    }
    std::optional<Token>::~optional((optional<Token> *)local_48);
  } while (bVar1);
  if ((p.super__Optional_base<Token,_false,_false>._M_payload.
       super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>._39_1_
      & 1) == 0) {
    std::vector<Token,_std::allocator<Token>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Token> Tokenizer::Tokenize() {
	std::vector<Token> result;
	while (true) {
		auto p = NextToken();
		if (p.has_value()) {
			result.emplace_back(p.value());
		}
		else {
			std::cout << "Tokenizer successful return." << std::endl;
			return result;
		}
	}
}